

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O0

float mpack_expect_float_strict(mpack_reader_t *reader)

{
  mpack_tag_t mVar1;
  undefined4 local_28;
  mpack_tag_t var;
  mpack_reader_t *reader_local;
  
  mVar1 = mpack_read_tag(reader);
  if (mVar1.type == mpack_type_float) {
    local_28 = mVar1.v._0_4_;
    reader_local._4_4_ = local_28;
  }
  else {
    mpack_reader_flag_error(reader,mpack_error_type);
    reader_local._4_4_ = 0.0;
  }
  return reader_local._4_4_;
}

Assistant:

float mpack_expect_float_strict(mpack_reader_t* reader) {
    mpack_tag_t var = mpack_read_tag(reader);
    if (var.type == mpack_type_float)
        return var.v.f;
    mpack_reader_flag_error(reader, mpack_error_type);
    return 0.0f;
}